

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O0

void __thiscall
HMatrix::setup(HMatrix *this,int numCol_,int numRow_,int *Astart_,int *Aindex_,double *Avalue_,
              int *nonbasicFlag_)

{
  int iVar1;
  value_type vVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  long in_stack_00000008;
  int iPut_1;
  int iRow_3;
  int k_3;
  int iPut;
  int iRow_2;
  int k_2;
  int iCol_1;
  int i_1;
  int i;
  int iRow_1;
  int k_1;
  int iRow;
  int k;
  int iCol;
  vector<int,_std::allocator<int>_> AR_Bend;
  int AcountX;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar5;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  value_type vVar6;
  undefined4 in_stack_ffffffffffffff28;
  int iVar7;
  undefined4 in_stack_ffffffffffffff2c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  value_type in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int local_8c;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_6c;
  int local_64;
  int local_60;
  vector<int,_std::allocator<int>_> local_48;
  undefined4 local_2c;
  long local_18;
  int local_c;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  local_18 = in_RCX;
  local_c = in_ESI;
  std::vector<int,std::allocator<int>>::assign<int_const*,void>
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30,
             (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (int *)in_stack_ffffffffffffff20);
  local_2c = *(undefined4 *)(local_18 + (long)local_c * 4);
  std::vector<int,std::allocator<int>>::assign<int_const*,void>
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30,
             (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (int *)in_stack_ffffffffffffff20);
  std::vector<double,std::allocator<double>>::assign<double_const*,void>
            (in_stack_ffffffffffffff30,
             (double *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (double *)in_stack_ffffffffffffff20);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16f046);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
             ,(value_type *)0x16f089);
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
             ,(value_type *)0x16f0b4);
  for (local_60 = 0; local_60 < *in_RDI; local_60 = local_60 + 1) {
    if (*(int *)(in_stack_00000008 + (long)local_60 * 4) == 0) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_60);
      for (local_6c = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(local_60 + 1)
                             ), local_6c < *pvVar3; local_6c = local_6c + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_6c);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)*pvVar3);
        *pvVar3 = *pvVar3 + 1;
      }
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_60);
      for (local_64 = *pvVar3;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(local_60 + 1)
                             ), local_64 < *pvVar3; local_64 = local_64 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_64);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)*pvVar3);
        *pvVar3 = *pvVar3 + 1;
      }
    }
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),0);
  *pvVar3 = 0;
  for (local_74 = 0; local_74 < in_RDI[1]; local_74 = local_74 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),(long)local_74);
    iVar7 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)local_74);
    iVar5 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_74);
    iVar1 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),(long)(local_74 + 1));
    *pvVar3 = iVar7 + iVar5 + iVar1;
  }
  for (local_78 = 0; local_78 < in_RDI[1]; local_78 = local_78 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),(long)local_78);
    in_stack_ffffffffffffff40 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)local_78);
    in_stack_ffffffffffffff44 = in_stack_ffffffffffffff40 + *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_78);
    *pvVar3 = in_stack_ffffffffffffff44;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x14),(long)local_78);
    vVar2 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)local_78);
    *pvVar3 = vVar2;
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  for (local_7c = 0; local_7c < *in_RDI; local_7c = local_7c + 1) {
    if (*(int *)(in_stack_00000008 + (long)local_7c * 4) == 0) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_7c);
      local_8c = *pvVar3;
      while (iVar7 = local_8c,
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),
                                (long)(local_7c + 1)), iVar7 < *pvVar3) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_8c);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)*pvVar3);
        iVar7 = *pvVar3;
        *pvVar3 = iVar7 + 1;
        iVar5 = local_7c;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)iVar7);
        *pvVar3 = iVar5;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_8c
                           );
        vVar6 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x26),(long)iVar7);
        *pvVar4 = vVar6;
        local_8c = local_8c + 1;
      }
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_7c);
      local_80 = *pvVar3;
      while (iVar7 = local_80,
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),
                                (long)(local_7c + 1)), iVar7 < *pvVar3) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_80);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)*pvVar3);
        iVar7 = *pvVar3;
        *pvVar3 = iVar7 + 1;
        iVar5 = local_7c;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)iVar7);
        *pvVar3 = iVar5;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_80
                           );
        in_stack_ffffffffffffff30 = (vector<double,_std::allocator<double>_> *)*pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x26),(long)iVar7);
        *pvVar4 = (value_type)in_stack_ffffffffffffff30;
        local_80 = local_80 + 1;
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30);
  return;
}

Assistant:

void HMatrix::setup(int numCol_, int numRow_, const int *Astart_,
		    const int *Aindex_, const double *Avalue_, const int *nonbasicFlag_) {
  //Copy the A matrix and setup row-wise matrix with the nonbasic
  //columns before the basic columns for a general set of nonbasic
  //variables
  //
  //Copy A
  numCol = numCol_;
  numRow = numRow_;
  Astart.assign(Astart_, Astart_ + numCol_ + 1);
  
  int AcountX = Astart_[numCol_];
  Aindex.assign(Aindex_, Aindex_ + AcountX);
  Avalue.assign(Avalue_, Avalue_ + AcountX);

  // Build row copy - pointers
  vector<int> AR_Bend;
  ARstart.resize(numRow + 1);
  AR_Nend.assign(numRow, 0);
  AR_Bend.assign(numRow, 0);
  //Count the nonzeros of nonbasic and basic columns in each row
  for (int iCol = 0; iCol < numCol; iCol++) {
    if (nonbasicFlag_[iCol]) {
      for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	int iRow = Aindex[k];
	AR_Nend[iRow]++;
      }
    } else {
      for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	int iRow = Aindex[k];
	AR_Bend[iRow]++;
      }
    }
  }
  ARstart[0] = 0;
  for (int i = 0; i < numRow; i++)
    ARstart[i+1] = ARstart[i] + AR_Nend[i] + AR_Bend[i];
  for (int i = 0; i < numRow; i++) {
    AR_Bend[i] = ARstart[i] + AR_Nend[i];
    AR_Nend[i] = ARstart[i];
  }
  // Build row copy - elements
  ARindex.resize(AcountX);
  ARvalue.resize(AcountX);
  for (int iCol = 0; iCol < numCol; iCol++) {
    if (nonbasicFlag_[iCol]) {
      for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	int iRow = Aindex[k];
	int iPut = AR_Nend[iRow]++;
	ARindex[iPut] = iCol;
	ARvalue[iPut] = Avalue[k];
      }
    } else {
      for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	int iRow = Aindex[k];
	int iPut = AR_Bend[iRow]++;
	ARindex[iPut] = iCol;
	ARvalue[iPut] = Avalue[k];
      }
    }
  }
#ifdef JAJH_dev
  assert(setup_ok(nonbasicFlag_));
#endif
}